

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_tab.c
# Opt level: O2

int lj_tab_isarray(GCtab *src)

{
  double dVar1;
  ulong uVar2;
  double *pdVar3;
  lua_Number n;
  undefined1 auVar4 [16];
  undefined1 in_XMM1 [16];
  
  uVar2 = (ulong)src->hmask;
  pdVar3 = (double *)(uVar2 * 0x18 + (src->node).ptr64 + 8);
  do {
    if ((long)uVar2 < 0) {
      return 1;
    }
    if (pdVar3[-1] != -NAN) {
      dVar1 = *pdVar3;
      if (0xfff8 < (ushort)((ulong)dVar1 >> 0x30)) {
        return 0;
      }
      auVar4._8_8_ = 0;
      auVar4._0_8_ = dVar1;
      in_XMM1 = roundsd(in_XMM1,auVar4,4);
      if (in_XMM1._0_8_ != dVar1) {
        return 0;
      }
      if (NAN(in_XMM1._0_8_) || NAN(dVar1)) {
        return 0;
      }
    }
    uVar2 = uVar2 - 1;
    pdVar3 = pdVar3 + -3;
  } while( true );
}

Assistant:

int LJ_FASTCALL lj_tab_isarray(const GCtab *src)
{
  Node *node;
  cTValue *o;
  ptrdiff_t i;

  node = noderef(src->node);
  for (i = (ptrdiff_t)src->hmask; i >= 0; i--)
    if (!tvisnil(&node[i].val)) {
      o = &node[i].key;
      if (LJ_UNLIKELY(tvisint(o))) {
        continue;
      }
      if (LJ_UNLIKELY(tvisnum(o))) {
        lua_Number n = numberVnum(o);
        if (LJ_LIKELY(rint((double) n) == n)) {
          continue;
        }
      }
      return 0;
    }

  return 1;
}